

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O1

void __thiscall Dependency::Dependency(Dependency *this,string *path,string *dependent_file)

{
  string *this_00;
  string *this_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer __lhs;
  string framework_path;
  string framework_name;
  string framework_root;
  string original_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string warning_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  char buffer [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1160;
  Dependency *local_1140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138;
  string local_1118;
  string *local_10f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1068;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1050;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1048;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1040;
  char local_1038 [4104];
  
  this->is_framework = false;
  this_00 = &this->filename;
  local_1040 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_1040;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  this_01 = &this->prefix;
  local_1048 = &(this->prefix).field_2;
  (this->prefix)._M_dataplus._M_p = (pointer)local_1048;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1090 = &this->new_name;
  local_1050 = &(this->new_name).field_2;
  (this->new_name)._M_dataplus._M_p = (pointer)local_1050;
  (this->new_name)._M_string_length = 0;
  (this->new_name).field_2._M_local_buf[0] = '\0';
  local_1140 = this;
  local_10f8 = dependent_file;
  rtrim_in_place(path);
  local_10d0._M_dataplus._M_p = (pointer)&local_10d0.field_2;
  local_10d0._M_string_length = 0;
  local_10d0.field_2._M_local_buf[0] = '\0';
  local_1088._M_dataplus._M_p = (pointer)&local_1088.field_2;
  local_1088._M_string_length = 0;
  local_1088.field_2._M_local_buf[0] = '\0';
  bVar1 = isRpath(path);
  if (bVar1) {
    searchFilenameInRpaths(&local_1118,path,local_10f8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_10d0,&local_1118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
      operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar4 = realpath((path->_M_dataplus)._M_p,local_1038);
    sVar7 = local_10d0._M_string_length;
    if (pcVar4 == (char *)0x0) {
      std::operator+(&local_1160,"\n/!\\ WARNING: Cannot resolve path \'",path);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1160,"\'\n");
      local_1118._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar9 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1118._M_dataplus._M_p == paVar9) {
        local_1118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_1118.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_1118._M_dataplus._M_p = (pointer)&local_1118.field_2;
      }
      else {
        local_1118.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_1118._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_1088,&local_1118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
        operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1160._M_dataplus._M_p != &local_1160.field_2) {
        operator_delete(local_1160._M_dataplus._M_p,local_1160.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_10d0,path);
    }
    else {
      sVar5 = strlen(local_1038);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_10d0,0,sVar7,local_1038,sVar5);
    }
  }
  bVar1 = Settings::verboseOutput();
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"** Dependency ctor **",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    sVar5 = path->_M_string_length;
    if ((sVar5 != local_10f8->_M_string_length) ||
       ((sVar5 != 0 &&
        (iVar3 = bcmp((path->_M_dataplus)._M_p,(local_10f8->_M_dataplus)._M_p,sVar5), iVar3 != 0))))
    {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  dependent file:  ",0x13);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(local_10f8->_M_dataplus)._M_p,
                          local_10f8->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  dependency path: ",0x13);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  original_file:   ",0x13);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_10d0._M_dataplus._M_p,
                        local_10d0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  if ((local_10d0._M_string_length != path->_M_string_length) ||
     ((local_10d0._M_string_length != 0 &&
      (iVar3 = bcmp(local_10d0._M_dataplus._M_p,(path->_M_dataplus)._M_p,local_10d0._M_string_length
                   ), iVar3 != 0)))) {
    AddSymlink(local_1140,path);
  }
  filePrefix(&local_1118,&local_10d0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_01,&local_1118);
  paVar9 = &local_1118.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1118._M_dataplus._M_p != paVar9) {
    operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
  }
  stripPrefix(&local_1118,&local_10d0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,&local_1118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1118._M_dataplus._M_p != paVar9) {
    operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
  }
  sVar7 = (local_1140->prefix)._M_string_length;
  if ((sVar7 != 0) && ((this_01->_M_dataplus)._M_p[sVar7 - 1] != '/')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_01,"/");
  }
  bVar1 = Settings::isPrefixBundled(this_01);
  if (bVar1) {
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&local_10d0,".framework",0,10);
    if (sVar7 != 0xffffffffffffffff) {
      local_1140->is_framework = true;
      getFrameworkRoot(&local_1118,&local_10d0);
      getFrameworkPath(&local_1160,&local_10d0);
      stripPrefix(&local_1138,&local_1118);
      filePrefix(&local_10f0,&local_1118);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_01,&local_10f0);
      paVar11 = &local_10f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10f0._M_dataplus._M_p != paVar11) {
        operator_delete(local_10f0._M_dataplus._M_p,local_10f0.field_2._M_allocated_capacity + 1);
      }
      local_10b0._M_dataplus._M_p = (pointer)&local_10b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_10b0,local_1138._M_dataplus._M_p,
                 local_1138._M_dataplus._M_p + local_1138._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_10b0,"/");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_10b0,local_1160._M_dataplus._M_p,local_1160._M_string_length);
      local_10f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10f0._M_dataplus._M_p == paVar10) {
        local_10f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_10f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_10f0._M_dataplus._M_p = (pointer)paVar11;
      }
      else {
        local_10f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_10f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_00,&local_10f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10f0._M_dataplus._M_p != paVar11) {
        operator_delete(local_10f0._M_dataplus._M_p,local_10f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
        operator_delete(local_10b0._M_dataplus._M_p,local_10b0.field_2._M_allocated_capacity + 1);
      }
      bVar1 = Settings::verboseOutput();
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  framework root: ",0x12);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_1118._M_dataplus._M_p,
                            local_1118._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  framework path: ",0x12);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_1160._M_dataplus._M_p,
                            local_1160._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  framework name: ",0x12);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_1138._M_dataplus._M_p,
                            local_1138._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
        operator_delete(local_1138._M_dataplus._M_p,local_1138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1160._M_dataplus._M_p != &local_1160.field_2) {
        operator_delete(local_1160._M_dataplus._M_p,local_1160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1118._M_dataplus._M_p != paVar9) {
        operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_1140->prefix)._M_string_length == 0) {
      bVar1 = true;
    }
    else {
      std::operator+(&local_1118,this_01,this_00);
      bVar1 = fileExists(&local_1118);
      bVar1 = !bVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1118._M_dataplus._M_p != paVar9) {
        operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar1) {
      Settings::searchPaths_abi_cxx11_();
      if (local_1068.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_1068.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        initSearchPaths();
      }
      if (local_1068.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1068.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        paVar9 = &local_1160.field_2;
        __lhs = local_1068.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        do {
          while( true ) {
            std::operator+(&local_1160,__lhs,this_00);
            bVar1 = fileExists(&local_1160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1160._M_dataplus._M_p != paVar9) {
              operator_delete(local_1160._M_dataplus._M_p,
                              local_1160.field_2._M_allocated_capacity + 1);
            }
            if (!bVar1) break;
            std::operator+(&local_10b0,"FOUND ",this_00);
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_10b0," in ");
            local_10f0._M_dataplus._M_p = (pointer)&local_10f0.field_2;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar8->_M_dataplus)._M_p;
            paVar10 = &pbVar8->field_2;
            if (paVar11 == paVar10) {
              local_10f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_10f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            }
            else {
              local_10f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_10f0._M_dataplus._M_p = (pointer)paVar11;
            }
            local_10f0._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append(&local_10f0,(__lhs->_M_dataplus)._M_p,__lhs->_M_string_length);
            local_1138._M_dataplus._M_p = (pointer)&local_1138.field_2;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar8->_M_dataplus)._M_p;
            paVar10 = &pbVar8->field_2;
            if (paVar11 == paVar10) {
              local_1138.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_1138.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            }
            else {
              local_1138.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_1138._M_dataplus._M_p = (pointer)paVar11;
            }
            local_1138._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_1138,"\n");
            local_1160._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar11 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1160._M_dataplus._M_p == paVar11) {
              local_1160.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_1160.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_1160._M_dataplus._M_p = (pointer)paVar9;
            }
            else {
              local_1160.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_1160._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_1088,local_1160._M_dataplus._M_p,local_1160._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1160._M_dataplus._M_p != paVar9) {
              operator_delete(local_1160._M_dataplus._M_p,
                              local_1160.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
              operator_delete(local_1138._M_dataplus._M_p,
                              local_1138.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_10f0._M_dataplus._M_p != &local_10f0.field_2) {
              operator_delete(local_10f0._M_dataplus._M_p,
                              local_10f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
              operator_delete(local_10b0._M_dataplus._M_p,
                              local_10b0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(this_01,__lhs);
            Settings::missingPrefixes(true);
            __lhs = __lhs + 1;
            if (bVar1 || __lhs == local_1068.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001069f2;
          }
          __lhs = __lhs + 1;
        } while (__lhs != local_1068.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
LAB_001069f2:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1068);
    }
    bVar1 = Settings::quietOutput();
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_1088._M_dataplus._M_p,local_1088._M_string_length);
    }
    bVar1 = Settings::isPrefixIgnored(this_01);
    if (bVar1) {
      bVar1 = false;
      bVar2 = false;
    }
    else if ((local_1140->prefix)._M_string_length == 0) {
      bVar2 = true;
      bVar1 = false;
    }
    else {
      std::operator+(&local_1160,this_01,this_00);
      bVar2 = fileExists(&local_1160);
      bVar2 = !bVar2;
      bVar1 = true;
    }
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1160._M_dataplus._M_p != &local_1160.field_2)) {
      operator_delete(local_1160._M_dataplus._M_p,local_1160.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      bVar1 = Settings::quietOutput();
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\n/!\\ WARNING: Dependency ",0x19);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(local_1140->filename)._M_dataplus._M_p,
                            (local_1140->filename)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," of ",4);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_10f8->_M_dataplus)._M_p,local_10f8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," not found\n",0xb);
      }
      bVar1 = Settings::verboseOutput();
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     path: ",0xb);
        std::operator+(&local_1138,this_01,this_00);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_1138._M_dataplus._M_p,
                            local_1138._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
          operator_delete(local_1138._M_dataplus._M_p,local_1138.field_2._M_allocated_capacity + 1);
        }
      }
      Settings::missingPrefixes(true);
      getUserInputDirForFile(&local_1138,this_00,local_10f8);
      Settings::addSearchPath(&local_1138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
        operator_delete(local_1138._M_dataplus._M_p,local_1138.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (local_1090,this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
    operator_delete(local_1088._M_dataplus._M_p,
                    CONCAT71(local_1088.field_2._M_allocated_capacity._1_7_,
                             local_1088.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d0._M_dataplus._M_p != &local_10d0.field_2) {
    operator_delete(local_10d0._M_dataplus._M_p,
                    CONCAT71(local_10d0.field_2._M_allocated_capacity._1_7_,
                             local_10d0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

Dependency::Dependency(string path, const string& dependent_file)
    : is_framework(false)
{
    char buffer[PATH_MAX];
    rtrim_in_place(path);
    string original_file;
    string warning_msg;

    if (isRpath(path))
    {
        original_file = searchFilenameInRpaths(path, dependent_file);
    }
    else if (realpath(path.c_str(), buffer))
    {
        original_file = buffer;
    }
    else
    {
        warning_msg = "\n/!\\ WARNING: Cannot resolve path '" + path + "'\n";
        original_file = path;
    }

    if (Settings::verboseOutput())
    {
        cout << "** Dependency ctor **" << endl;
        if (path != dependent_file)
            cout << "  dependent file:  " << dependent_file << endl;
        cout << "  dependency path: " << path << endl;
        cout << "  original_file:   " << original_file << endl;
    }

    // check if given path is a symlink
    if (original_file != path)
        AddSymlink(path);

    prefix = filePrefix(original_file);
    filename = stripPrefix(original_file);

    if (!prefix.empty() && prefix[prefix.size()-1] != '/')
        prefix += "/";

    // check if this dependency is in /usr/lib, /System/Library, or in ignored list
    if (!Settings::isPrefixBundled(prefix))
        return;

    if (original_file.find(".framework") != string::npos)
    {
        is_framework = true;
        string framework_root = getFrameworkRoot(original_file);
        string framework_path = getFrameworkPath(original_file);
        string framework_name = stripPrefix(framework_root);
        prefix = filePrefix(framework_root);
        filename = framework_name + "/" + framework_path;
        if (Settings::verboseOutput())
        {
            cout << "  framework root: " << framework_root << endl;
            cout << "  framework path: " << framework_path << endl;
            cout << "  framework name: " << framework_name << endl;
        }
    }

    // check if the lib is in a known location
    if (prefix.empty() || !fileExists(prefix+filename))
    {
        vector<string> search_paths = Settings::searchPaths();
        if (search_paths.empty())
            initSearchPaths();
        // check if file is contained in one of the paths
        for (const auto& search_path : search_paths)
        {
            if (fileExists(search_path+filename))
            {
                warning_msg += "FOUND " + filename + " in " + search_path + "\n";
                prefix = search_path;
                Settings::missingPrefixes(true);
                break;
            }
        }
    }

    if (!Settings::quietOutput())
        cout << warning_msg;

    // if the location is still unknown, ask the user for search path
    if (!Settings::isPrefixIgnored(prefix) && (prefix.empty() || !fileExists(prefix+filename)))
    {
        if (!Settings::quietOutput())
            cerr << "\n/!\\ WARNING: Dependency " << filename << " of " << dependent_file << " not found\n";
        if (Settings::verboseOutput())
            cout << "     path: " << (prefix+filename) << endl;
        Settings::missingPrefixes(true);
        Settings::addSearchPath(getUserInputDirForFile(filename, dependent_file));
    }
    new_name = filename;
}